

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O1

bool __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::SaveType
          (KotlinKMPGenerator *this,string *defname,Namespace *ns,string *classcode,
          bool needs_includes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *__s;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  IdlNamer *this_00;
  string namespace_name;
  string code;
  string dirs;
  string qualified;
  string filename;
  string local_f0;
  long *local_d0;
  size_t local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  if (classcode->_M_string_length == 0) {
    bVar2 = true;
  }
  else {
    __s = BaseGenerator::FlatBuffersGeneratedWarning();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,__s,(allocator<char> *)&local_b0);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x36de3f);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_90.field_2._M_allocated_capacity = *psVar4;
      local_90.field_2._8_8_ = plVar3[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar4;
      local_90._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_90._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d0 = &local_c0;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_c0 = *plVar5;
      lStack_b8 = plVar3[3];
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*plVar3;
    }
    local_c8 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_f0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    Namespace::GetFullyQualifiedName(&local_90,ns,&local_f0,1000);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    this_00 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[10])(&local_f0,this_00,ns);
    if (local_f0._M_string_length != 0) {
      std::operator+(&local_b0,"package ",&local_f0);
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_d0);
    }
    if (needs_includes) {
      std::__cxx11::string::append((char *)&local_d0);
    }
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(classcode->_M_dataplus)._M_p);
    (*(this_00->super_Namer)._vptr_Namer[0xd])(&local_b0,this_00,ns,0,0);
    EnsureDirExists(&local_b0);
    Namer::File(&local_50,&this_00->super_Namer,defname,Suffix);
    plVar3 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_50,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_60 = *plVar5;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar5;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar2 = SaveFile((char *)local_70,(char *)local_d0,local_c8,false);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
  }
  return bVar2;
}

Assistant:

bool SaveType(const std::string &defname, const Namespace &ns,
                const std::string &classcode, bool needs_includes) const {
    if (!classcode.length()) return true;

    std::string code =
        "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";
    auto qualified = ns.GetFullyQualifiedName("");
    std::string namespace_name = namer_.Namespace(ns);
    if (!namespace_name.empty()) {
      code += "package " + namespace_name;
      code += "\n\n";
    }
    if (needs_includes) { code += "import com.google.flatbuffers.kotlin.*\n"; }
    code += "import kotlin.jvm.JvmInline\n";
    code += classcode;
    const std::string dirs =
        namer_.Directories(ns, SkipDir::None, Case::kUnknown);
    EnsureDirExists(dirs);
    const std::string filename =
        dirs + namer_.File(defname, /*skips=*/SkipFile::Suffix);
    return SaveFile(filename.c_str(), code, false);
  }